

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

Symbol __thiscall GrcSymbolTableEntry::BaseLigComponent(GrcSymbolTableEntry *this)

{
  bool bVar1;
  Symbol this_00;
  GrcSymbolTableEntry *in_RDI;
  Symbol psymParent;
  char *in_stack_ffffffffffffffd8;
  Symbol local_8;
  
  this_00 = ParentSymbol(in_RDI);
  bVar1 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
  local_8 = in_RDI;
  if (!bVar1) {
    local_8 = BaseLigComponent(this_00);
  }
  return local_8;
}

Assistant:

Symbol GrcSymbolTableEntry::BaseLigComponent()
{
	Assert(FitsSymbolType(ksymtGlyphAttr) ||
		FitsSymbolType(ksymtSlotAttr) ||
		FitsSymbolType(ksymtNonLeafGlyphAttr));

	Symbol psymParent = ParentSymbol();
	Assert(psymParent);
	if (psymParent->m_staFieldName == "component")
		return this;
	else
		return psymParent->BaseLigComponent();
}